

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

bool __thiscall wasm::RandomFullLattice::meet(RandomFullLattice *this,Element *a,Element *b)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_tools_wasm_fuzz_lattices_cpp:928:5),_const_std::variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>_&,_std::variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>_&,_const_std::variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>_&>
  _Var1;
  type __variants;
  ElementImpl *__variants_1;
  ElementImpl *__variants_2;
  anon_class_1_0_00000001 local_21;
  Element *local_20;
  Element *b_local;
  Element *a_local;
  RandomFullLattice *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (Element *)this;
  __variants = std::
               unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
               ::operator*(&this->lattice);
  __variants_1 = RandomElement<wasm::RandomFullLattice>::operator*(b_local);
  __variants_2 = RandomElement<wasm::RandomFullLattice>::operator*(local_20);
  _Var1 = std::
          visit<wasm::RandomFullLattice::meet(wasm::RandomElement<wasm::RandomFullLattice>&,wasm::RandomElement<wasm::RandomFullLattice>const&)const::__0,std::variant<wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>const&,std::variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>&,std::variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>const&>
                    (&local_21,&__variants->super_FullLatticeVariant,
                     &__variants_1->super_FullLatticeElementVariant,
                     &__variants_2->super_FullLatticeElementVariant);
  return _Var1;
}

Assistant:

bool RandomFullLattice::meet(Element& a, const Element& b) const noexcept {
  return std::visit(
    [](const auto& l, auto& elemA, const auto& elemB) -> bool {
      using ElemT = typename bare<decltype(l)>::Element;
      using A = bare<decltype(elemA)>;
      using B = bare<decltype(elemB)>;
      if constexpr (std::is_same_v<ElemT, A> && std::is_same_v<ElemT, B>) {
        return l.meet(elemA, elemB);
      }
      WASM_UNREACHABLE("unexpected element types");
    },
    (const FullLatticeVariant&)*lattice,
    (FullLatticeElementVariant&)*a,
    (const FullLatticeElementVariant&)*b);
}